

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

ssize_t __thiscall
phosg::StringReader::pread(StringReader *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  undefined4 in_register_00000034;
  ulong uVar1;
  StringReader *local_38;
  size_t ret;
  size_t size_local;
  void *data_local;
  size_t offset_local;
  StringReader *this_local;
  
  uVar1 = CONCAT44(in_register_00000034,__fd);
  if (uVar1 < this->length) {
    if (this->length < uVar1 + __nbytes) {
      memcpy(__buf,this->data + uVar1,this->length - uVar1);
      local_38 = (StringReader *)(this->length - uVar1);
    }
    else {
      memcpy(__buf,this->data + uVar1,__nbytes);
      local_38 = (StringReader *)__nbytes;
    }
    this_local = local_38;
  }
  else {
    this_local = (StringReader *)0x0;
  }
  return (ssize_t)this_local;
}

Assistant:

size_t StringReader::pread(size_t offset, void* data, size_t size) const {
  if (offset >= this->length) {
    return 0;
  }

  size_t ret;
  if (offset + size > this->length) {
    memcpy(data, this->data + offset, this->length - offset);
    ret = this->length - offset;
  } else {
    memcpy(data, this->data + offset, size);
    ret = size;
  }
  return ret;
}